

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LoadStackArgPtr(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset_00;
  StackSym *pSVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  IndirOpnd *pIVar6;
  Instr *instr_00;
  Instr *instrLdParams;
  RegOpnd *tmpOpnd;
  IndirOpnd *indirOpnd;
  size_t offset;
  RegOpnd *baseOpnd;
  Instr *instr_local;
  LowererMD *this_local;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  if (bVar2) {
    pSVar3 = Func::GetLoopParamSym(this->m_func);
    if (pSVar3 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x23e,"(this->m_func->GetLoopParamSym())",
                         "this->m_func->GetLoopParamSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar3 = Func::GetLoopParamSym(this->m_func);
    pRVar5 = IR::RegOpnd::New(pSVar3,TyInt64,this->m_func);
    offset_00 = Js::InterpreterStackFrame::GetOffsetOfInParams();
    pIVar6 = IR::IndirOpnd::New(pRVar5,offset_00,TyInt64,this->m_func,false);
    pRVar5 = IR::RegOpnd::New(TyInt64,this->m_func);
    instr_00 = IR::Instr::New(MOV,&pRVar5->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    pIVar6 = IR::IndirOpnd::New(pRVar5,8,TyInt64,this->m_func,false);
    IR::Instr::SetSrc1(instr,&pIVar6->super_Opnd);
    instr->m_opcode = LEA;
    this_local = (LowererMD *)instr->m_prev;
  }
  else {
    this_local = (LowererMD *)LowererMDArch::LoadStackArgPtr(&this->lowererMDArch,instr);
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
LowererMD::LoadStackArgPtr(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the first user param from the interpreter frame instance that was passed in.
        // These args don't include the func object and callinfo; we just need to advance past "this".

        // t1 = MOV [prm1 + m_inParams]
        // dst = LEA &[t1 + sizeof(var)]

        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        size_t offset = Js::InterpreterStackFrame::GetOffsetOfInParams();
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
        IR::RegOpnd *tmpOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::Instr *instrLdParams = IR::Instr::New(Js::OpCode::MOV, tmpOpnd, indirOpnd, this->m_func);
        instr->InsertBefore(instrLdParams);

        indirOpnd = IR::IndirOpnd::New(tmpOpnd, sizeof(Js::Var), TyMachReg, this->m_func);
        instr->SetSrc1(indirOpnd);
        instr->m_opcode = Js::OpCode::LEA;

        return instr->m_prev;
    }
    else
    {
        return this->lowererMDArch.LoadStackArgPtr(instr);
    }
}